

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O3

void __thiscall
cmVariableWatch::RemoveWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data)

{
  element_type *peVar1;
  const_iterator cVar2;
  mapped_type *this_00;
  iterator __position;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
                  *)this,variable);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->WatchMap)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>_>_>_>
              ::operator[](&this->WatchMap,variable);
    for (__position._M_current =
              (this_00->
              super__Vector_base<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (this_00->
        super__Vector_base<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
        )._M_impl.super__Vector_impl_data._M_finish;
        __position._M_current = __position._M_current + 1) {
      peVar1 = ((__position._M_current)->
               super___shared_ptr<cmVariableWatch::Pair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1->Method == method) &&
         ((client_data == (void *)0x0 || (peVar1->ClientData == client_data)))) {
        std::
        vector<std::shared_ptr<cmVariableWatch::Pair>,_std::allocator<std::shared_ptr<cmVariableWatch::Pair>_>_>
        ::_M_erase(this_00,__position);
        return;
      }
    }
  }
  return;
}

Assistant:

void cmVariableWatch::RemoveWatch(const std::string& variable,
                                  WatchMethod method, void* client_data /*=0*/)
{
  if (!this->WatchMap.count(variable)) {
    return;
  }
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::iterator it;
  for (it = vp->begin(); it != vp->end(); ++it) {
    if ((*it)->Method == method &&
        // If client_data is NULL, we want to disconnect all watches against
        // the given method; otherwise match ClientData as well.
        (!client_data || (client_data == (*it)->ClientData))) {
      vp->erase(it);
      return;
    }
  }
}